

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionPackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,bool inclass)

{
  undefined3 in_register_00000009;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (CONCAT31(in_register_00000009,inclass) == 0) {
    EscapeKeyword(&local_100,this,(string *)enum_def);
    std::operator+(&local_140,&local_100,"Union::");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"",(allocator<char> *)&local_100);
  }
  std::operator+(&local_e0,"::flatbuffers::Offset<void> ",&local_140);
  std::operator+(&local_c0,&local_e0,"Pack(");
  GetBuilder_abi_cxx11_(&local_120,this);
  std::operator+(&local_a0,&local_c0,&local_120);
  std::operator+(&local_80,&local_a0," &_fbb, ");
  std::operator+(&local_60,&local_80,"const ::flatbuffers::rehasher_function_t *_rehasher");
  __rhs = "";
  if (inclass) {
    __rhs = " = nullptr";
  }
  std::operator+(&local_40,&local_60,__rhs);
  std::operator+(__return_storage_ptr__,&local_40,") const");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_140);
  if (!inclass) {
    std::__cxx11::string::~string((string *)&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnionPackSignature(const EnumDef &enum_def, bool inclass) {
    return "::flatbuffers::Offset<void> " +
           (inclass ? "" : Name(enum_def) + "Union::") + "Pack(" +
           GetBuilder() + " &_fbb, " +
           "const ::flatbuffers::rehasher_function_t *_rehasher" +
           (inclass ? " = nullptr" : "") + ") const";
  }